

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.c
# Opt level: O1

PyObject * libxml_xmlXPathObjectPtrWrap(xmlXPathObjectPtr obj)

{
  xmlNodePtr pxVar1;
  xmlNodeSetPtr pxVar2;
  undefined8 uVar3;
  _xmlNode *p_Var4;
  undefined *puVar5;
  _xmlNode **pp_Var6;
  uint uVar7;
  ulong uVar8;
  PyObject *pPVar9;
  long lVar10;
  
  if (obj == (xmlXPathObjectPtr)0x0) {
    pPVar9 = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
  }
  else {
    switch(obj->type) {
    case XPATH_NODESET:
      if ((obj->nodesetval == (xmlNodeSetPtr)0x0) || (obj->nodesetval->nodeNr == 0)) {
        pPVar9 = (PyObject *)PyList_New(0);
      }
      else {
        pPVar9 = (PyObject *)PyList_New();
        pxVar2 = obj->nodesetval;
        if (0 < pxVar2->nodeNr) {
          lVar10 = 0;
          do {
            pxVar1 = pxVar2->nodeTab[lVar10];
            if (pxVar1->type == XML_NAMESPACE_DECL) {
              uVar3 = PyCapsule_New(pxVar1,"xmlNsPtr",libxml_xmlXPathDestructNsNode);
              PyList_SetItem(pPVar9,lVar10,uVar3);
              obj->nodesetval->nodeTab[lVar10] = (xmlNodePtr)0x0;
            }
            else {
              if (pxVar1 == (xmlNodePtr)0x0) {
                __Py_NoneStruct = __Py_NoneStruct + 1;
                puVar5 = &_Py_NoneStruct;
              }
              else {
                puVar5 = (undefined *)PyCapsule_New(pxVar1,"xmlNodePtr",0);
              }
              PyList_SetItem(pPVar9,lVar10,puVar5);
            }
            lVar10 = lVar10 + 1;
            pxVar2 = obj->nodesetval;
          } while (lVar10 < pxVar2->nodeNr);
        }
      }
      break;
    case XPATH_BOOLEAN:
      pPVar9 = (PyObject *)PyLong_FromLong((long)obj->boolval);
      break;
    case XPATH_NUMBER:
      pPVar9 = (PyObject *)PyFloat_FromDouble(obj->floatval);
      break;
    case XPATH_STRING:
      pPVar9 = (PyObject *)PyUnicode_FromString(obj->stringval);
      break;
    default:
      pPVar9 = (PyObject *)&_Py_NoneStruct;
      __Py_NoneStruct = __Py_NoneStruct + 1;
      break;
    case XPATH_XSLT_TREE:
      pxVar2 = obj->nodesetval;
      if (((pxVar2 == (xmlNodeSetPtr)0x0) || (pxVar2->nodeNr == 0)) ||
         (pxVar2->nodeTab == (xmlNodePtr *)0x0)) {
        pPVar9 = (PyObject *)PyList_New(0);
        return pPVar9;
      }
      uVar7 = 0;
      for (p_Var4 = (*pxVar2->nodeTab)->children; p_Var4 != (_xmlNode *)0x0; p_Var4 = p_Var4->next)
      {
        uVar7 = uVar7 + 1;
      }
      pPVar9 = (PyObject *)PyList_New((ulong)uVar7);
      if (uVar7 == 0) {
        return pPVar9;
      }
      pp_Var6 = &(*obj->nodesetval->nodeTab)->children;
      uVar8 = 0;
      do {
        p_Var4 = *pp_Var6;
        if (p_Var4 == (_xmlNode *)0x0) {
          __Py_NoneStruct = __Py_NoneStruct + 1;
          puVar5 = &_Py_NoneStruct;
        }
        else {
          puVar5 = (undefined *)PyCapsule_New(p_Var4,"xmlNodePtr",0);
        }
        PyList_SetItem(pPVar9,uVar8,puVar5);
        pp_Var6 = &p_Var4->next;
        uVar8 = uVar8 + 1;
      } while (uVar7 != uVar8);
      return pPVar9;
    }
    xmlXPathFreeObject(obj);
  }
  return pPVar9;
}

Assistant:

PyObject *
libxml_xmlXPathObjectPtrWrap(xmlXPathObjectPtr obj)
{
    PyObject *ret;

    if (obj == NULL) {
        Py_INCREF(Py_None);
        return (Py_None);
    }
    switch (obj->type) {
        case XPATH_XSLT_TREE: {
            if ((obj->nodesetval == NULL) ||
		(obj->nodesetval->nodeNr == 0) ||
		(obj->nodesetval->nodeTab == NULL)) {
                ret = PyList_New(0);
	    } else {
		int i, len = 0;
		xmlNodePtr node;

		node = obj->nodesetval->nodeTab[0]->children;
		while (node != NULL) {
		    len++;
		    node = node->next;
		}
		ret = PyList_New(len);
		node = obj->nodesetval->nodeTab[0]->children;
		for (i = 0;i < len;i++) {
                    PyList_SetItem(ret, i, libxml_xmlNodePtrWrap(node));
		    node = node->next;
		}
	    }
	    /*
	     * Return now, do not free the object passed down
	     */
	    return (ret);
	}
        case XPATH_NODESET:
            if ((obj->nodesetval == NULL)
                || (obj->nodesetval->nodeNr == 0)) {
                ret = PyList_New(0);
	    } else {
                int i;
                xmlNodePtr node;

                ret = PyList_New(obj->nodesetval->nodeNr);
                for (i = 0; i < obj->nodesetval->nodeNr; i++) {
                    node = obj->nodesetval->nodeTab[i];
                    if (node->type == XML_NAMESPACE_DECL) {
		        PyObject *ns = PyCapsule_New((void *) node,
                                     (char *) "xmlNsPtr",
				     libxml_xmlXPathDestructNsNode);
			PyList_SetItem(ret, i, ns);
			/* make sure the xmlNsPtr is not destroyed now */
			obj->nodesetval->nodeTab[i] = NULL;
		    } else {
			PyList_SetItem(ret, i, libxml_xmlNodePtrWrap(node));
		    }
                }
            }
            break;
        case XPATH_BOOLEAN:
            ret = PY_IMPORT_INT((long) obj->boolval);
            break;
        case XPATH_NUMBER:
            ret = PyFloat_FromDouble(obj->floatval);
            break;
        case XPATH_STRING:
	    ret = PY_IMPORT_STRING((char *) obj->stringval);
            break;
        default:
            Py_INCREF(Py_None);
            ret = Py_None;
    }
    xmlXPathFreeObject(obj);
    return (ret);
}